

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86.cpp
# Opt level: O0

int __thiscall ncnn::PReLU_x86::forward_inplace(PReLU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  undefined1 (*pauVar2) [16];
  Mat *in_RSI;
  long *in_RDI;
  int remain;
  float slope_1;
  float *ptr_4;
  int q_1;
  float *slope_data_ptr;
  int size;
  int channels;
  int h;
  int w;
  __m128 _p_3;
  int i_3;
  __m128 _slope_3;
  float *ptr_3;
  int q;
  int size_1;
  int channels_1;
  int h_2;
  int w_3;
  __m128 _p_2;
  int j;
  __m128 _slope_2;
  float *ptr_2;
  int i_2;
  int h_1;
  int w_2;
  __m128 _p_1;
  float *ptr_1;
  int i_1;
  __m128 _slope_1;
  __m128 _slope;
  __m128 _p;
  float *ptr;
  int i;
  float *slope;
  int w_1;
  int elempack;
  int dims;
  __m128 neg_3;
  __m128 pos_3;
  __m128 neg_2;
  __m128 pos_2;
  __m128 neg_1;
  __m128 pos_1;
  __m128 neg;
  __m128 pos;
  float local_6fc;
  undefined8 local_6e8;
  undefined8 in_stack_fffffffffffff920;
  Mat *in_stack_fffffffffffff928;
  Mat *this_00;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  int local_6b0;
  Mat local_6a8;
  float *local_660;
  int local_654;
  float *local_650;
  int local_648;
  int local_644;
  int local_640;
  int local_63c;
  undefined8 local_638;
  Option *in_stack_fffffffffffff9d0;
  Mat *in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e4;
  int iVar3;
  Mat local_5f0;
  undefined1 (*local_5a8) [16];
  int local_59c;
  int local_598;
  int local_594;
  int local_590;
  int local_58c;
  undefined8 local_588;
  undefined8 uStack_580;
  int local_56c;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined1 (*local_550) [16];
  int local_544;
  int local_540;
  int local_53c;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined1 (*local_528) [16];
  int local_51c;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined1 (*local_4e8) [16];
  int local_4dc;
  float *local_4d8;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  Mat *local_4b8;
  int local_4a4;
  undefined1 (*local_4a0) [16];
  float *local_498;
  undefined1 (*local_490) [16];
  float *local_488;
  undefined1 (*local_480) [16];
  float *local_478;
  undefined1 (*local_470) [16];
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined1 (*local_450) [16];
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  undefined1 (*local_430) [16];
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 (*local_410) [16];
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined1 (*local_3f0) [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_4c4 = in_RSI->dims;
  local_4c8 = in_RSI->elempack;
  if (local_4c8 == 4) {
    local_4b8 = in_RSI;
    if (local_4c4 == 1) {
      local_4cc = in_RSI->w;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) {
        pfVar1 = ncnn::Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),0);
        local_2a8 = *pfVar1;
        local_518 = CONCAT44(local_2a8,local_2a8);
        uStack_510 = CONCAT44(local_2a8,local_2a8);
        fStack_2a4 = local_2a8;
        fStack_2a0 = local_2a8;
        fStack_29c = local_2a8;
        local_298 = local_2a8;
        for (local_51c = 0; local_51c < local_4cc; local_51c = local_51c + 1) {
          pfVar1 = ncnn::Mat::operator_cast_to_float_(local_4b8);
          local_528 = (undefined1 (*) [16])(pfVar1 + (local_51c << 2));
          local_538 = *(undefined8 *)*local_528;
          uStack_530 = *(undefined8 *)(*local_528 + 8);
          local_348 = local_518;
          uStack_340 = uStack_510;
          local_1d8 = 0;
          uStack_1d0 = 0;
          local_258 = 0;
          uStack_250 = 0;
          local_358 = maxps(ZEXT816(0),*local_528);
          local_1e8 = 0;
          uStack_1e0 = 0;
          local_158 = 0;
          uStack_150 = 0;
          local_368 = minps(ZEXT816(0),*local_528);
          local_58._0_4_ = (float)local_518;
          local_58._4_4_ = (float)((ulong)local_518 >> 0x20);
          uStack_50._0_4_ = (float)uStack_510;
          uStack_50._4_4_ = (float)((ulong)uStack_510 >> 0x20);
          local_68._0_4_ = local_368._0_4_;
          local_68._4_4_ = local_368._4_4_;
          uStack_60._0_4_ = local_368._8_4_;
          uStack_60._4_4_ = local_368._12_4_;
          local_e8 = (float)local_58 * (float)local_68;
          fStack_e4 = local_58._4_4_ * local_68._4_4_;
          fStack_e0 = (float)uStack_50 * (float)uStack_60;
          fStack_dc = uStack_50._4_4_ * uStack_60._4_4_;
          local_d8._0_4_ = local_358._0_4_;
          local_d8._4_4_ = local_358._4_4_;
          uStack_d0._0_4_ = local_358._8_4_;
          uStack_d0._4_4_ = local_358._12_4_;
          local_428 = (float)local_d8 + local_e8;
          fStack_424 = local_d8._4_4_ + fStack_e4;
          fStack_420 = (float)uStack_d0 + fStack_e0;
          fStack_41c = uStack_d0._4_4_ + fStack_dc;
          *(ulong *)*local_528 = CONCAT44(fStack_424,local_428);
          *(ulong *)(*local_528 + 8) = CONCAT44(fStack_41c,fStack_420);
          local_480 = local_528;
          local_410 = local_528;
          local_338 = local_538;
          uStack_330 = uStack_530;
          local_268 = local_538;
          uStack_260 = uStack_530;
          local_168 = local_538;
          uStack_160 = uStack_530;
          local_d8 = local_358._0_8_;
          uStack_d0 = local_358._8_8_;
          local_68 = local_368._0_8_;
          uStack_60 = local_368._8_8_;
          local_58 = local_518;
          uStack_50 = uStack_510;
        }
      }
      else {
        local_4d8 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8));
        for (local_4dc = 0; local_4dc < local_4cc; local_4dc = local_4dc + 1) {
          pfVar1 = ncnn::Mat::operator_cast_to_float_(local_4b8);
          local_4e8 = (undefined1 (*) [16])(pfVar1 + (local_4dc << 2));
          local_4f8 = *(undefined8 *)*local_4e8;
          uStack_4f0 = *(undefined8 *)(*local_4e8 + 8);
          local_478 = local_4d8 + (local_4dc << 2);
          local_508 = *(undefined8 *)local_478;
          uStack_500 = *(undefined8 *)(local_478 + 2);
          local_1f8 = 0;
          uStack_1f0 = 0;
          local_278 = 0;
          uStack_270 = 0;
          local_318 = maxps(ZEXT816(0),*local_4e8);
          local_208 = 0;
          uStack_200 = 0;
          local_178 = 0;
          uStack_170 = 0;
          local_328 = minps(ZEXT816(0),*local_4e8);
          local_78._0_4_ = (float)local_508;
          local_78._4_4_ = (float)((ulong)local_508 >> 0x20);
          uStack_70._0_4_ = (float)uStack_500;
          uStack_70._4_4_ = (float)((ulong)uStack_500 >> 0x20);
          local_88._0_4_ = local_328._0_4_;
          local_88._4_4_ = local_328._4_4_;
          uStack_80._0_4_ = local_328._8_4_;
          uStack_80._4_4_ = local_328._12_4_;
          local_108 = (float)local_78 * (float)local_88;
          fStack_104 = local_78._4_4_ * local_88._4_4_;
          fStack_100 = (float)uStack_70 * (float)uStack_80;
          fStack_fc = uStack_70._4_4_ * uStack_80._4_4_;
          local_f8._0_4_ = local_318._0_4_;
          local_f8._4_4_ = local_318._4_4_;
          uStack_f0._0_4_ = local_318._8_4_;
          uStack_f0._4_4_ = local_318._12_4_;
          local_408 = (float)local_f8 + local_108;
          fStack_404 = local_f8._4_4_ + fStack_104;
          fStack_400 = (float)uStack_f0 + fStack_100;
          fStack_3fc = uStack_f0._4_4_ + fStack_fc;
          *(ulong *)*local_4e8 = CONCAT44(fStack_404,local_408);
          *(ulong *)(*local_4e8 + 8) = CONCAT44(fStack_3fc,fStack_400);
          local_470 = local_4e8;
          local_3f0 = local_4e8;
          local_308 = local_508;
          uStack_300 = uStack_500;
          local_2f8 = local_4f8;
          uStack_2f0 = uStack_4f0;
          local_288 = local_4f8;
          uStack_280 = uStack_4f0;
          local_188 = local_4f8;
          uStack_180 = uStack_4f0;
          local_f8 = local_318._0_8_;
          uStack_f0 = local_318._8_8_;
          local_88 = local_328._0_8_;
          uStack_80 = local_328._8_8_;
          local_78 = local_508;
          uStack_70 = uStack_500;
        }
      }
    }
    if (local_4c4 == 2) {
      local_53c = local_4b8->w;
      local_540 = local_4b8->h;
      for (local_544 = 0; local_544 < local_540; local_544 = local_544 + 1) {
        local_550 = (undefined1 (*) [16])ncnn::Mat::row(local_4b8,local_544);
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) {
          pfVar1 = ncnn::Mat::operator[]
                             ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),0);
          local_2c8 = *pfVar1;
          local_6c8 = CONCAT44(local_2c8,local_2c8);
          uStack_6c0 = CONCAT44(local_2c8,local_2c8);
          fStack_2c4 = local_2c8;
          fStack_2c0 = local_2c8;
          fStack_2bc = local_2c8;
          local_2b8 = local_2c8;
        }
        else {
          local_488 = ncnn::Mat::operator_cast_to_float_
                                ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8));
          local_488 = local_488 + (local_544 << 2);
          local_6c8 = *(undefined8 *)local_488;
          uStack_6c0 = *(undefined8 *)(local_488 + 2);
        }
        local_568 = local_6c8;
        uStack_560 = uStack_6c0;
        for (local_56c = 0; local_56c < local_53c; local_56c = local_56c + 1) {
          local_490 = local_550;
          local_588 = *(undefined8 *)*local_550;
          uStack_580 = *(undefined8 *)(*local_550 + 8);
          local_430 = local_550;
          local_388 = local_6c8;
          uStack_380 = uStack_6c0;
          local_1b8 = 0;
          uStack_1b0 = 0;
          local_238 = 0;
          uStack_230 = 0;
          local_398 = maxps(ZEXT816(0),*local_550);
          local_1c8 = 0;
          uStack_1c0 = 0;
          local_138 = 0;
          uStack_130 = 0;
          local_3a8 = minps(ZEXT816(0),*local_550);
          local_38._0_4_ = (float)local_6c8;
          local_38._4_4_ = (float)((ulong)local_6c8 >> 0x20);
          uStack_30._0_4_ = (float)uStack_6c0;
          uStack_30._4_4_ = (float)((ulong)uStack_6c0 >> 0x20);
          local_48._0_4_ = local_3a8._0_4_;
          local_48._4_4_ = local_3a8._4_4_;
          uStack_40._0_4_ = local_3a8._8_4_;
          uStack_40._4_4_ = local_3a8._12_4_;
          local_c8 = (float)local_38 * (float)local_48;
          fStack_c4 = local_38._4_4_ * local_48._4_4_;
          fStack_c0 = (float)uStack_30 * (float)uStack_40;
          fStack_bc = uStack_30._4_4_ * uStack_40._4_4_;
          local_b8._0_4_ = local_398._0_4_;
          local_b8._4_4_ = local_398._4_4_;
          uStack_b0._0_4_ = local_398._8_4_;
          uStack_b0._4_4_ = local_398._12_4_;
          local_448 = (float)local_b8 + local_c8;
          fStack_444 = local_b8._4_4_ + fStack_c4;
          fStack_440 = (float)uStack_b0 + fStack_c0;
          fStack_43c = uStack_b0._4_4_ + fStack_bc;
          *(ulong *)*local_550 = CONCAT44(fStack_444,local_448);
          *(ulong *)(*local_550 + 8) = CONCAT44(fStack_43c,fStack_440);
          local_550 = local_550 + 1;
          local_378 = local_588;
          uStack_370 = uStack_580;
          local_248 = local_588;
          uStack_240 = uStack_580;
          local_148 = local_588;
          uStack_140 = uStack_580;
          local_b8 = local_398._0_8_;
          uStack_b0 = local_398._8_8_;
          local_48 = local_3a8._0_8_;
          uStack_40 = local_3a8._8_8_;
          local_38 = local_6c8;
          uStack_30 = uStack_6c0;
        }
      }
    }
    if (local_4c4 == 3) {
      local_58c = local_4b8->w;
      local_590 = local_4b8->h;
      local_594 = local_4b8->c;
      local_598 = local_58c * local_590;
      for (local_59c = 0; local_59c < local_594; local_59c = local_59c + 1) {
        this_00 = &local_5f0;
        ncnn::Mat::channel(this_00,(int)((ulong)in_stack_fffffffffffff920 >> 0x20));
        pauVar2 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(this_00);
        ncnn::Mat::~Mat((Mat *)0x502e35);
        local_5a8 = pauVar2;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) {
          pfVar1 = ncnn::Mat::operator[]
                             ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),0);
          local_2e8 = *pfVar1;
          local_6e8 = CONCAT44(local_2e8,local_2e8);
          in_stack_fffffffffffff920 = CONCAT44(local_2e8,local_2e8);
          fStack_2e4 = local_2e8;
          fStack_2e0 = local_2e8;
          fStack_2dc = local_2e8;
          local_2d8 = local_2e8;
        }
        else {
          local_498 = ncnn::Mat::operator_cast_to_float_
                                ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8));
          local_498 = local_498 + (local_59c << 2);
          local_6e8 = *(undefined8 *)local_498;
          in_stack_fffffffffffff920 = *(undefined8 *)(local_498 + 2);
        }
        for (iVar3 = 0; iVar3 < local_598; iVar3 = iVar3 + 1) {
          local_4a0 = local_5a8;
          local_638 = *(undefined8 *)*local_5a8;
          uStack_3b0 = *(undefined8 *)(*local_5a8 + 8);
          local_450 = local_5a8;
          local_3c8 = local_6e8;
          local_198 = 0;
          uStack_190 = 0;
          local_218 = 0;
          uStack_210 = 0;
          local_3d8 = maxps(ZEXT816(0),*local_5a8);
          local_1a8 = 0;
          uStack_1a0 = 0;
          local_118 = 0;
          uStack_110 = 0;
          local_3e8 = minps(ZEXT816(0),*local_5a8);
          local_18._0_4_ = (float)local_6e8;
          local_18._4_4_ = (float)((ulong)local_6e8 >> 0x20);
          uStack_10._0_4_ = (float)in_stack_fffffffffffff920;
          uStack_10._4_4_ = (float)((ulong)in_stack_fffffffffffff920 >> 0x20);
          local_28._0_4_ = local_3e8._0_4_;
          local_28._4_4_ = local_3e8._4_4_;
          uStack_20._0_4_ = local_3e8._8_4_;
          uStack_20._4_4_ = local_3e8._12_4_;
          local_a8 = (float)local_18 * (float)local_28;
          fStack_a4 = local_18._4_4_ * local_28._4_4_;
          fStack_a0 = (float)uStack_10 * (float)uStack_20;
          fStack_9c = uStack_10._4_4_ * uStack_20._4_4_;
          local_98._0_4_ = local_3d8._0_4_;
          local_98._4_4_ = local_3d8._4_4_;
          uStack_90._0_4_ = local_3d8._8_4_;
          uStack_90._4_4_ = local_3d8._12_4_;
          local_468 = (float)local_98 + local_a8;
          fStack_464 = local_98._4_4_ + fStack_a4;
          fStack_460 = (float)uStack_90 + fStack_a0;
          fStack_45c = uStack_90._4_4_ + fStack_9c;
          *(ulong *)*local_5a8 = CONCAT44(fStack_464,local_468);
          *(ulong *)(*local_5a8 + 8) = CONCAT44(fStack_45c,fStack_460);
          local_5a8 = local_5a8 + 1;
          uStack_3c0 = in_stack_fffffffffffff920;
          local_3b8 = local_638;
          local_228 = local_638;
          uStack_220 = uStack_3b0;
          local_128 = local_638;
          uStack_120 = uStack_3b0;
          local_98 = local_3d8._0_8_;
          uStack_90 = local_3d8._8_8_;
          local_28 = local_3e8._0_8_;
          uStack_20 = local_3e8._8_8_;
          local_18 = local_6e8;
          uStack_10 = in_stack_fffffffffffff920;
        }
      }
    }
    local_4a4 = 0;
  }
  else if (local_4c4 == 3) {
    local_63c = in_RSI->w;
    local_640 = in_RSI->h;
    local_644 = in_RSI->c;
    local_648 = local_63c * local_640;
    local_650 = ncnn::Mat::operator_cast_to_float_
                          ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8));
    for (local_654 = 0; local_654 < local_644; local_654 = local_654 + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffff928,(int)((ulong)in_stack_fffffffffffff920 >> 0x20));
      pfVar1 = ncnn::Mat::operator_cast_to_float_(&local_6a8);
      ncnn::Mat::~Mat((Mat *)0x5031d9);
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2) {
        local_6fc = *local_650;
      }
      else {
        local_6fc = local_650[local_654];
      }
      local_660 = pfVar1;
      for (local_6b0 = local_648; 0 < local_6b0; local_6b0 = local_6b0 + -1) {
        if (*local_660 <= 0.0 && *local_660 != 0.0) {
          *local_660 = local_6fc * *local_660;
        }
        local_660 = local_660 + 1;
      }
    }
    local_4a4 = 0;
  }
  else {
    local_4a4 = PReLU::forward_inplace
                          ((PReLU *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                           in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  }
  return local_4a4;
}

Assistant:

int PReLU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _slope = _mm256_loadu_ps(slope + i * 8);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
            else
            {
                __m256 _slope = _mm256_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _slope = _mm_loadu_ps(slope + i * 4);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
            else
            {
                __m128 _slope = _mm_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3)
        return PReLU::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    const float* slope_data_ptr = slope_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        float slope = num_slope > 1 ? slope_data_ptr[q] : slope_data_ptr[0];

#if __AVX__
        int nn = size >> 3;
        int remain = size - (nn << 3);
#else
        int remain = size;
#endif // __AVX__

#if __AVX__
        for (; nn > 0; nn--)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, prelu_avx(_p, _mm256_set1_ps(slope)));
            ptr += 8;
        }
#endif // __AVX__
        for (; remain > 0; remain--)
        {
            if (*ptr < 0)
                *ptr *= slope;

            ptr++;
        }
    }

    return 0;
}